

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O2

void __thiscall
sznet::net::KcpWithTcpServer::KcpWithTcpServer
          (KcpWithTcpServer *this,KcpTcpEventLoop *loop,InetAddress *listenAddr,
          vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *udpListenAddrs,
          string *nameArg,int kcpMode,Option option)

{
  _Rb_tree_header *p_Var1;
  vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *__x;
  KcpTcpEventLoop *pKVar2;
  Acceptor *pAVar3;
  KcpTcpEventLoopThreadPool *this_00;
  undefined4 in_register_0000008c;
  SourceFile file;
  SourceFile local_98;
  _Bind<void_(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
  local_88;
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
  local_70;
  string *local_50;
  string *local_48;
  int local_3c;
  vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *local_38;
  
  local_3c = kcpMode;
  local_38 = udpListenAddrs;
  Logger::SourceFile::SourceFile<107>
            (&local_98,
             (char (*) [107])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpServer.cpp"
            );
  file.m_data = (char *)(ulong)(uint)local_98.m_size;
  file._8_8_ = 0x10;
  pKVar2 = CheckNotNull<sznet::net::KcpTcpEventLoop>
                     ((sznet *)local_98.m_data,file,0x14e64d,(char *)loop,
                      (KcpTcpEventLoop *)CONCAT44(in_register_0000008c,kcpMode));
  this->m_loop = pKVar2;
  InetAddress::toIpPort_abi_cxx11_(&this->m_ipPort,listenAddr);
  local_48 = &this->m_name;
  local_50 = &this->m_ipPort;
  std::__cxx11::string::string((string *)local_48,(string *)nameArg);
  pAVar3 = (Acceptor *)operator_new(0xf0);
  Acceptor::Acceptor(pAVar3,&loop->super_EventLoop,listenAddr,option == kReusePort);
  (this->m_acceptor)._M_t.
  super___uniq_ptr_impl<sznet::net::Acceptor,_std::default_delete<sznet::net::Acceptor>_>._M_t.
  super__Tuple_impl<0UL,_sznet::net::Acceptor_*,_std::default_delete<sznet::net::Acceptor>_>.
  super__Head_base<0UL,_sznet::net::Acceptor_*,_false>._M_head_impl = pAVar3;
  this_00 = (KcpTcpEventLoopThreadPool *)operator_new(0x80);
  __x = local_38;
  KcpTcpEventLoopThreadPool::KcpTcpEventLoopThreadPool(this_00,loop,local_38,local_48);
  std::__shared_ptr<sznet::net::KcpTcpEventLoopThreadPool,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sznet::net::KcpTcpEventLoopThreadPool,void>
            ((__shared_ptr<sznet::net::KcpTcpEventLoopThreadPool,(__gnu_cxx::_Lock_policy)2> *)
             &this->m_threadPool,this_00);
  p_Var1 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->m_kcpWriteCompleteCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpWriteCompleteCallback).super__Function_base._M_functor + 8) = 0
  ;
  (this->m_kcpWriteCompleteCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpWriteCompleteCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_threadInitCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_threadInitCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_threadInitCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_threadInitCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_kcpConnectionCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpConnectionCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_kcpConnectionCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpConnectionCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_kcpMessageCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpMessageCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_kcpMessageCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpMessageCallback)._M_invoker = (_Invoker_type)0x0;
  this->m_started = (__atomic_base<int>)0x0;
  this->m_nextConnId = 1;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::vector
            (&this->m_udpListenAddrs,__x);
  local_88._M_f = (offset_in_KcpWithTcpServer_to_subr)tcpMessage;
  local_88._8_8_ = 0;
  local_88._M_bound_args.
  super__Tuple_impl<0UL,_sznet::net::KcpWithTcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_sznet::net::KcpWithTcpServer_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sznet::net::KcpWithTcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_sznet::net::KcpWithTcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )this;
  std::
  function<void(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp)>
  ::
  function<std::_Bind<void(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp)>,void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp)>
              *)&local_70,&local_88);
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
  ::function(&(this->m_tcpCodec).m_messageCallback,&local_70);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  this->m_kcpMode = local_3c;
  pAVar3 = (this->m_acceptor)._M_t.
           super___uniq_ptr_impl<sznet::net::Acceptor,_std::default_delete<sznet::net::Acceptor>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Acceptor_*,_std::default_delete<sznet::net::Acceptor>_>
           .super__Head_base<0UL,_sznet::net::Acceptor_*,_false>._M_head_impl;
  local_88._M_f = (offset_in_KcpWithTcpServer_to_subr)newConnection;
  local_88._8_8_ = 0;
  local_88._M_bound_args.
  super__Tuple_impl<0UL,_sznet::net::KcpWithTcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_sznet::net::KcpWithTcpServer_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sznet::net::KcpWithTcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_sznet::net::KcpWithTcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )this;
  std::function<void(int,sznet::net::InetAddress_const&)>::
  function<std::_Bind<void(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer*,std::_Placeholder<1>,std::_Placeholder<2>))(int,sznet::net::InetAddress_const&)>,void>
            ((function<void(int,sznet::net::InetAddress_const&)> *)&local_70,
             (_Bind<void_(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_const_sznet::net::InetAddress_&)>
              *)&local_88);
  std::function<void_(int,_const_sznet::net::InetAddress_&)>::operator=
            (&pAVar3->m_newConnectionCallback,
             (function<void_(int,_const_sznet::net::InetAddress_&)> *)&local_70);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  return;
}

Assistant:

KcpWithTcpServer::KcpWithTcpServer(KcpTcpEventLoop* loop, const InetAddress& listenAddr, const std::vector<InetAddress>& udpListenAddrs, const string& nameArg, int kcpMode, Option option) :
	m_loop(CHECK_NOTNULL(loop)),
	m_ipPort(listenAddr.toIpPort()),
	m_name(nameArg),
	m_acceptor(new Acceptor(loop, listenAddr, option == kReusePort)),
	m_threadPool(new KcpTcpEventLoopThreadPool(loop, udpListenAddrs, m_name)),
	m_started(0),
	m_nextConnId(1),
	m_udpListenAddrs(udpListenAddrs),
	m_tcpCodec(std::bind(&KcpWithTcpServer::tcpMessage, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3)),
	m_kcpMode(kcpMode)
{
	m_acceptor->setNewConnectionCallback(std::bind(&KcpWithTcpServer::newConnection, this, std::placeholders::_1, std::placeholders::_2));
}